

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSweep.c
# Opt level: O2

int Abc_NtkCheckConstant_rec(Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = -1;
  while( true ) {
    iVar2 = (pObj->vFanins).nSize;
    uVar1 = *(uint *)&pObj->field_0x14 & 0xf;
    if (iVar2 == 0) {
      if (uVar1 == 7) {
        iVar2 = Abc_NodeIsConst0(pObj);
        iVar3 = 0;
        if (iVar2 == 0) {
          iVar3 = Abc_NodeIsConst1(pObj);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                          ,0x30a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
          }
          iVar3 = 1;
        }
      }
      return iVar3;
    }
    if (1 < iVar2) {
      return -1;
    }
    if (uVar1 == 8) {
      return -1;
    }
    if ((uVar1 == 7) && (iVar2 = Abc_NodeIsBuf(pObj), iVar2 == 0)) break;
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
  }
  iVar3 = Abc_NodeIsInv(pObj);
  if (iVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcSweep.c"
                  ,0x31a,"int Abc_NtkCheckConstant_rec(Abc_Obj_t *)");
  }
  iVar3 = Abc_NtkCheckConstant_rec((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray]);
  if (iVar3 == 0) {
    return 1;
  }
  return -(uint)(iVar3 != 1);
}

Assistant:

int Abc_NtkCheckConstant_rec( Abc_Obj_t * pObj )
{
    if ( Abc_ObjFaninNum(pObj) == 0 )
    {
        if ( !Abc_ObjIsNode(pObj) )
            return -1;
        if ( Abc_NodeIsConst0(pObj) )
            return 0;
        if ( Abc_NodeIsConst1(pObj) )
            return 1;
        assert( 0 );
        return -1;
    }
    if ( Abc_ObjIsLatch(pObj) || Abc_ObjFaninNum(pObj) > 1 )
        return -1;
    if ( !Abc_ObjIsNode(pObj) || Abc_NodeIsBuf(pObj) )
        return Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
    if ( Abc_NodeIsInv(pObj) )
    {
        int RetValue = Abc_NtkCheckConstant_rec( Abc_ObjFanin0(pObj) );
        if ( RetValue == 0 )
            return 1;
        if ( RetValue == 1 )
            return 0;
        return RetValue;
    }
    assert( 0 );
    return -1;
}